

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::StoreProperty<cmValue>(cmTarget *this,string *prop,cmValue value)

{
  size_t __n;
  _Head_base<0UL,_cmTargetInternals_*,_false> _Var1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  __type _Var5;
  bool bVar6;
  int iVar7;
  ostream *poVar8;
  cmGlobalGenerator *this_00;
  cmValue cVar9;
  mapped_type *this_01;
  cmake *pcVar10;
  cmTarget *this_02;
  char *extraout_RDX;
  string *psVar11;
  _Alloc_hider _Var12;
  undefined1 in_R9B;
  string_view value_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> __str;
  size_type __dnew;
  string reusedFrom;
  ostringstream e;
  cmValue local_260;
  string local_258;
  string local_238;
  undefined1 local_218 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  undefined1 local_1f8 [80];
  ios_base local_1a8 [264];
  cmListFileBacktrace local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  __n = prop->_M_string_length;
  local_260.Value = value.Value;
  if ((__n == DAT_008e00e8) &&
     ((__n == 0 ||
      (iVar7 = bcmp((prop->_M_dataplus)._M_p,
                    (anonymous_namespace)::propMANUALLY_ADDED_DEPENDENCIES_abi_cxx11_,__n),
      iVar7 == 0)))) {
    pcVar2 = ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    local_218._0_8_ = &local_208;
    local_258._M_dataplus._M_p = (pointer)0x32;
    local_218._0_8_ = std::__cxx11::string::_M_create((ulong *)local_218,(ulong)&local_258);
    local_208._M_allocated_capacity = (size_type)local_258._M_dataplus._M_p;
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)(local_218._0_8_ + 0x20))->_M_allocated_capacity = 0x2073692079747265;
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_218._0_8_ + 0x20);
    *(char *)((long)paVar4 + 8) = 'r';
    *(char *)((long)paVar4 + 9) = 'e';
    *(char *)((long)paVar4 + 10) = 'a';
    *(char *)((long)paVar4 + 0xb) = 'd';
    *(char *)((long)paVar4 + 0xc) = '-';
    *(char *)((long)paVar4 + 0xd) = 'o';
    *(char *)((long)paVar4 + 0xe) = 'n';
    *(char *)((long)paVar4 + 0xf) = 'l';
    ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      *)(local_218._0_8_ + 0x10))->_M_allocated_capacity = 0x434e45444e455045;
    paVar4 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_218._0_8_ + 0x10);
    *(char *)((long)paVar4 + 8) = 'I';
    *(char *)((long)paVar4 + 9) = 'E';
    *(char *)((long)paVar4 + 10) = 'S';
    *(char *)((long)paVar4 + 0xb) = ' ';
    *(char *)((long)paVar4 + 0xc) = 'p';
    *(char *)((long)paVar4 + 0xd) = 'r';
    *(char *)((long)paVar4 + 0xe) = 'o';
    *(char *)((long)paVar4 + 0xf) = 'p';
    *(undefined8 *)local_218._0_8_ = 0x594c4c41554e414d;
    *(char *)(local_218._0_8_ + 8) = '_';
    *(char *)(local_218._0_8_ + 9) = 'A';
    *(char *)(local_218._0_8_ + 10) = 'D';
    *(char *)(local_218._0_8_ + 0xb) = 'D';
    *(char *)(local_218._0_8_ + 0xc) = 'E';
    *(char *)(local_218._0_8_ + 0xd) = 'D';
    *(char *)(local_218._0_8_ + 0xe) = '_';
    *(char *)(local_218._0_8_ + 0xf) = 'D';
    *(undefined2 *)(local_218._0_8_ + 0x30) = 0xa79;
    local_218._8_8_ = local_258._M_dataplus._M_p;
    local_258._M_dataplus._M_p[local_218._0_8_] = '\0';
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_218);
  }
  else if ((__n == DAT_008e0108) &&
          ((__n == 0 ||
           (iVar7 = bcmp((prop->_M_dataplus)._M_p,(anonymous_namespace)::propNAME_abi_cxx11_,__n),
           iVar7 == 0)))) {
    pcVar2 = ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    local_218._0_8_ = &local_208;
    local_258._M_dataplus._M_p = (pointer)0x1b;
    local_218._0_8_ = std::__cxx11::string::_M_create((ulong *)local_218,(ulong)&local_258);
    local_208._M_allocated_capacity = (size_type)local_258._M_dataplus._M_p;
    *(char *)(local_218._0_8_ + 0xb) = 't';
    *(char *)(local_218._0_8_ + 0xc) = 'y';
    *(char *)(local_218._0_8_ + 0xd) = ' ';
    *(char *)(local_218._0_8_ + 0xe) = 'i';
    *(char *)(local_218._0_8_ + 0xf) = 's';
    *(char *)(local_218._0_8_ + 0x10) = ' ';
    *(char *)(local_218._0_8_ + 0x11) = 'r';
    *(char *)(local_218._0_8_ + 0x12) = 'e';
    builtin_strncpy((char *)((long)(local_218._0_8_ + 0x10) + 3),"ad-only\n",8);
    *(undefined8 *)local_218._0_8_ = 0x6f727020454d414e;
    *(char *)(local_218._0_8_ + 8) = 'p';
    *(char *)(local_218._0_8_ + 9) = 'e';
    *(char *)(local_218._0_8_ + 10) = 'r';
    *(char *)(local_218._0_8_ + 0xb) = 't';
    *(char *)(local_218._0_8_ + 0xc) = 'y';
    *(char *)(local_218._0_8_ + 0xd) = ' ';
    *(char *)(local_218._0_8_ + 0xe) = 'i';
    *(char *)(local_218._0_8_ + 0xf) = 's';
    local_218._8_8_ = local_258._M_dataplus._M_p;
    local_258._M_dataplus._M_p[local_218._0_8_] = '\0';
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_218);
  }
  else {
    if ((__n != DAT_008e0148) ||
       ((__n != 0 &&
        (iVar7 = bcmp((prop->_M_dataplus)._M_p,(anonymous_namespace)::propTYPE_abi_cxx11_,__n),
        iVar7 != 0)))) {
      if ((__n == DAT_008e0008) &&
         (((__n == 0 ||
           (iVar7 = bcmp((prop->_M_dataplus)._M_p,(anonymous_namespace)::propEXPORT_NAME_abi_cxx11_,
                         __n), iVar7 == 0)) &&
          (((this->impl)._M_t.
            super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
            super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
            super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget ==
           true)))) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_218,"EXPORT_NAME property can\'t be set on imported targets (\""
                   ,0x38);
        _Var1._M_head_impl =
             (this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_218,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                            *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\")\n",3);
        pcVar2 = ((this->impl)._M_t.
                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
        std::__cxx11::stringbuf::str();
        cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_258);
LAB_0028a9d8:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p == &local_258.field_2) goto LAB_0028a9f3;
        local_238.field_2._M_allocated_capacity =
             CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                      local_258.field_2._M_local_buf[0]);
        local_238._M_dataplus._M_p = local_258._M_dataplus._M_p;
      }
      else {
        if (((__n == DAT_008e0128) &&
            ((__n == 0 ||
             (iVar7 = bcmp((prop->_M_dataplus)._M_p,(anonymous_namespace)::propSOURCES_abi_cxx11_,
                           __n), iVar7 == 0)))) &&
           (((this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->IsImportedTarget ==
            true)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"SOURCES property can\'t be set on imported targets (\"",
                     0x34);
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_218,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                              *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\")\n",3);
          pcVar2 = ((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_258);
          goto LAB_0028a9d8;
        }
        if (((__n == DAT_008e0048) &&
            ((__n == 0 ||
             (iVar7 = bcmp((prop->_M_dataplus)._M_p,
                           (anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_,__n), iVar7 == 0)))
            ) && (((this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                  IsImportedTarget == false)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,
                     "IMPORTED_GLOBAL property can\'t be set on non-imported targets (\"",0x40);
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_218,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                              *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\")\n",3);
          pcVar2 = ((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_258);
          goto LAB_0028a9d8;
        }
        if ((__n == DAT_008e0068) &&
           ((__n == 0 ||
            (iVar7 = bcmp((prop->_M_dataplus)._M_p,
                          (anonymous_namespace)::propINCLUDE_DIRECTORIES_abi_cxx11_,__n), iVar7 == 0
            )))) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->IncludeDirectoriesEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->IncludeDirectoriesEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260.Value == (string *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<cmValue&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      IncludeDirectoriesEntries,&local_260,(cmListFileBacktrace *)local_218);
LAB_0028ad3d:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._8_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            return;
          }
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._8_8_);
          return;
        }
        if ((__n == DAT_008dff88) &&
           ((__n == 0 ||
            (iVar7 = bcmp((prop->_M_dataplus)._M_p,
                          (anonymous_namespace)::propCOMPILE_OPTIONS_abi_cxx11_,__n), iVar7 == 0))))
        {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->CompileOptionsEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->CompileOptionsEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260.Value == (string *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<cmValue&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      CompileOptionsEntries,&local_260,(cmListFileBacktrace *)local_218);
          goto LAB_0028ad3d;
        }
        if ((__n == DAT_008dff68) &&
           ((__n == 0 ||
            (iVar7 = bcmp((prop->_M_dataplus)._M_p,
                          (anonymous_namespace)::propCOMPILE_FEATURES_abi_cxx11_,__n), iVar7 == 0)))
           ) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->CompileFeaturesEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->CompileFeaturesEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260.Value == (string *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<cmValue&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      CompileFeaturesEntries,&local_260,(cmListFileBacktrace *)local_218);
          goto LAB_0028ad3d;
        }
        if ((__n == DAT_008dff48) &&
           ((__n == 0 ||
            (iVar7 = bcmp((prop->_M_dataplus)._M_p,
                          (anonymous_namespace)::propCOMPILE_DEFINITIONS_abi_cxx11_,__n), iVar7 == 0
            )))) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->CompileDefinitionsEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->CompileDefinitionsEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260.Value == (string *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<cmValue&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      CompileDefinitionsEntries,&local_260,(cmListFileBacktrace *)local_218);
          goto LAB_0028ad3d;
        }
        if ((__n == DAT_008e0088) &&
           ((__n == 0 ||
            (iVar7 = bcmp((prop->_M_dataplus)._M_p,
                          (anonymous_namespace)::propLINK_OPTIONS_abi_cxx11_,__n), iVar7 == 0)))) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->LinkOptionsEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->LinkOptionsEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260.Value == (string *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<cmValue&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkOptionsEntries,&local_260,(cmListFileBacktrace *)local_218);
          goto LAB_0028ad3d;
        }
        if ((__n == DAT_008e00a8) &&
           ((__n == 0 ||
            (iVar7 = bcmp((prop->_M_dataplus)._M_p,
                          (anonymous_namespace)::propLINK_DIRECTORIES_abi_cxx11_,__n), iVar7 == 0)))
           ) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->LinkDirectoriesEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->LinkDirectoriesEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260.Value == (string *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<cmValue&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkDirectoriesEntries,&local_260,(cmListFileBacktrace *)local_218);
          goto LAB_0028ad3d;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::propPRECOMPILE_HEADERS_abi_cxx11_);
        if (_Var5) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->PrecompileHeadersEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->PrecompileHeadersEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260.Value == (string *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<cmValue&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      PrecompileHeadersEntries,&local_260,(cmListFileBacktrace *)local_218);
          goto LAB_0028ad3d;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::propLINK_LIBRARIES_abi_cxx11_);
        if (_Var5) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->LinkImplementationPropertyEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->LinkImplementationPropertyEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260.Value == (string *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<cmValue&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkImplementationPropertyEntries,&local_260,(cmListFileBacktrace *)local_218)
          ;
          goto LAB_0028ad3d;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::
                                         propINTERFACE_LINK_LIBRARIES_abi_cxx11_);
        if (_Var5) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->LinkInterfacePropertyEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->LinkInterfacePropertyEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260.Value == (string *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<cmValue&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkInterfacePropertyEntries,&local_260,(cmListFileBacktrace *)local_218);
          goto LAB_0028ad3d;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::
                                         propINTERFACE_LINK_LIBRARIES_DIRECT_abi_cxx11_);
        if (_Var5) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->LinkInterfaceDirectPropertyEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->LinkInterfaceDirectPropertyEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260.Value == (string *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<cmValue&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkInterfaceDirectPropertyEntries,&local_260,(cmListFileBacktrace *)local_218
                    );
          goto LAB_0028ad3d;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::
                                         propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE_abi_cxx11_);
        if (_Var5) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->LinkInterfaceDirectExcludePropertyEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->LinkInterfaceDirectExcludePropertyEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260.Value == (string *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<cmValue&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      LinkInterfaceDirectExcludePropertyEntries,&local_260,
                     (cmListFileBacktrace *)local_218);
          goto LAB_0028ad3d;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::propSOURCES_abi_cxx11_);
        if (_Var5) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          std::
          vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::_M_erase_at_end(&(_Var1._M_head_impl)->SourceEntries,
                            *(pointer *)
                             &((_Var1._M_head_impl)->SourceEntries).
                              super__Vector_base<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           );
          if (local_260.Value == (string *)0x0) {
            return;
          }
          cmMakefile::GetBacktrace
                    (((this->impl)._M_t.
                      super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                      .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
          std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
          emplace_back<cmValue&,cmListFileBacktrace&>
                    ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
                     &((this->impl)._M_t.
                       super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                       .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                      SourceEntries,&local_260,(cmListFileBacktrace *)local_218);
          goto LAB_0028ad3d;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::propIMPORTED_GLOBAL_abi_cxx11_);
        if (_Var5) {
          if ((local_260.Value != (string *)0x0) &&
             (value_00._M_str = extraout_RDX,
             value_00._M_len = (size_t)((local_260.Value)->_M_dataplus)._M_p,
             bVar6 = cmValue::IsOn((cmValue *)(local_260.Value)->_M_string_length,value_00), bVar6))
          {
            _Var1._M_head_impl =
                 (this->impl)._M_t.
                 super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                 .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
            if ((_Var1._M_head_impl)->ImportedGloballyVisible != false) {
              return;
            }
            (_Var1._M_head_impl)->ImportedGloballyVisible = true;
            this_00 = cmMakefile::GetGlobalGenerator((_Var1._M_head_impl)->Makefile);
            cmGlobalGenerator::IndexTarget(this_00,this);
            return;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,
                     "IMPORTED_GLOBAL property can\'t be set to FALSE on targets (\"",0x3c);
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_218,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                              *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\")\n",3);
          pcVar2 = ((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_258);
          goto LAB_0028a9d8;
        }
        local_218._8_8_ = (prop->_M_dataplus)._M_p;
        local_218._0_8_ = prop->_M_string_length;
        bVar6 = false;
        __str._M_str = "IMPORTED_LIBNAME";
        __str._M_len = 0x10;
        iVar7 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)local_218,0,0x10,
                           __str);
        if (iVar7 == 0) {
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
          if (local_260.Value == (string *)0x0) {
            local_258._M_string_length = 0;
            local_258.field_2._M_local_buf[0] = '\0';
          }
          else {
            pcVar3 = ((local_260.Value)->_M_dataplus)._M_p;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_258,pcVar3,pcVar3 + (local_260.Value)->_M_string_length);
          }
          bVar6 = cmTargetInternals::CheckImportedLibName(_Var1._M_head_impl,prop,&local_258);
          bVar6 = !bVar6;
        }
        if ((iVar7 == 0) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2)) {
          operator_delete(local_258._M_dataplus._M_p,
                          CONCAT71(local_258.field_2._M_allocated_capacity._1_7_,
                                   local_258.field_2._M_local_buf[0]) + 1);
        }
        if (bVar6) {
          return;
        }
        _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&(anonymous_namespace)::propCUDA_PTX_COMPILATION_abi_cxx11_)
        ;
        if ((_Var5) &&
           (((this->impl)._M_t.
             super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t.
             super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
             super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->TargetType != 4)) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,
                     "CUDA_PTX_COMPILATION property can only be applied to OBJECT targets (\"",0x46)
          ;
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_218,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                              *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\")\n",3);
          pcVar2 = ((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_238);
        }
        else {
          _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                        *)&(anonymous_namespace)::
                                           propPRECOMPILE_HEADERS_REUSE_FROM_abi_cxx11_);
          if (!_Var5) {
            _Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)&(anonymous_namespace)::propC_STANDARD_abi_cxx11_);
            if (((((!_Var5) &&
                  (_Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&(anonymous_namespace)::
                                                    propCXX_STANDARD_abi_cxx11_), !_Var5)) &&
                 (_Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&(anonymous_namespace)::
                                                   propCUDA_STANDARD_abi_cxx11_), !_Var5)) &&
                ((_Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)(anonymous_namespace)::propHIP_STANDARD_abi_cxx11_
                                         ), !_Var5 &&
                 (_Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                *)&(anonymous_namespace)::
                                                   propOBJC_STANDARD_abi_cxx11_), !_Var5)))) &&
               (_Var5 = std::operator==(prop,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                              *)&(anonymous_namespace)::
                                                 propOBJCXX_STANDARD_abi_cxx11_), !_Var5)) {
              _Var1._M_head_impl =
                   (this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
              bVar6 = anon_unknown.dwarf_937b9f::FileSetType::WriteProperties<cmValue>
                                (&(_Var1._M_head_impl)->HeadersFileSets,this,_Var1._M_head_impl,prop
                                 ,local_260,(bool)in_R9B);
              if (bVar6) {
                return;
              }
              _Var1._M_head_impl =
                   (this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
              bVar6 = anon_unknown.dwarf_937b9f::FileSetType::WriteProperties<cmValue>
                                (&(_Var1._M_head_impl)->CxxModulesFileSets,this,_Var1._M_head_impl,
                                 prop,local_260,(bool)in_R9B);
              if (bVar6) {
                return;
              }
              _Var1._M_head_impl =
                   (this->impl)._M_t.
                   super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                   .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
              bVar6 = anon_unknown.dwarf_937b9f::FileSetType::WriteProperties<cmValue>
                                (&(_Var1._M_head_impl)->CxxModuleHeadersFileSets,this,
                                 _Var1._M_head_impl,prop,local_260,(bool)in_R9B);
              if (bVar6) {
                return;
              }
              cmPropertyMap::SetProperty
                        (&((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          Properties,prop,local_260);
              return;
            }
            if (local_260.Value == (string *)0x0) {
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::erase(&((this->impl)._M_t.
                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                        .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                       LanguageStandardProperties,prop);
              return;
            }
            pcVar3 = ((local_260.Value)->_M_dataplus)._M_p;
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_90,pcVar3,pcVar3 + (local_260.Value)->_M_string_length);
            cmMakefile::GetBacktrace
                      (((this->impl)._M_t.
                        super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                        .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile);
            BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            BTs((BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_218,&local_90,&local_a0);
            this_01 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      ::operator[](&((this->impl)._M_t.
                                     super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                     .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl
                                    )->LanguageStandardProperties,prop);
            std::__cxx11::string::operator=((string *)this_01,(string *)local_218);
            std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::_M_move_assign
                      (&this_01->Backtraces,local_1f8);
            BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
            ~BTs((BTs<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_218);
            if (local_a0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_a0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                         TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            _Var12._M_p = local_90._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_90._M_dataplus._M_p == &local_90.field_2) {
              return;
            }
            goto LAB_0028a8b9;
          }
          local_218._0_8_ = &local_208;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_218,"PRECOMPILE_HEADERS","");
          cVar9 = GetProperty(this,(string *)local_218);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_218._0_8_ != &local_208) {
            operator_delete((void *)local_218._0_8_,(ulong)(local_208._M_allocated_capacity + 1));
          }
          if (cVar9.Value == (string *)0x0) {
            pcVar10 = cmMakefile::GetCMakeInstance
                                (((this->impl)._M_t.
                                  super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                                  .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                                 Makefile);
            psVar11 = local_260.Value;
            if (local_260.Value == (string *)0x0) {
              psVar11 = &cmValue::Empty_abi_cxx11_;
            }
            this_02 = cmGlobalGenerator::FindTarget
                                ((pcVar10->GlobalGenerator)._M_t.
                                 super___uniq_ptr_impl<cmGlobalGenerator,_std::default_delete<cmGlobalGenerator>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmGlobalGenerator_*,_std::default_delete<cmGlobalGenerator>_>
                                 .super__Head_base<0UL,_cmGlobalGenerator_*,_false>._M_head_impl,
                                 psVar11,false);
            if (this_02 == (cmTarget *)0x0) {
              local_218._0_8_ = &local_208;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_218,
                         "PRECOMPILE_HEADERS_REUSE_FROM set with non existing target","");
              cmMakefile::IssueMessage
                        (((this->impl)._M_t.
                          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                          .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile
                         ,FATAL_ERROR,(string *)local_218);
              local_90.field_2._M_allocated_capacity = local_208._M_allocated_capacity;
              _Var12._M_p = (pointer)local_218._0_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._0_8_ == &local_208) {
                return;
              }
            }
            else {
              psVar11 = GetSafeProperty(this_02,prop);
              pcVar3 = (psVar11->_M_dataplus)._M_p;
              local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_238,pcVar3,pcVar3 + psVar11->_M_string_length);
              if ((_func_int **)local_238._M_string_length == (_func_int **)0x0) {
                psVar11 = local_260.Value;
                if (local_260.Value == (string *)0x0) {
                  psVar11 = &cmValue::Empty_abi_cxx11_;
                }
                pcVar3 = (psVar11->_M_dataplus)._M_p;
                local_218._0_8_ = &local_208;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)local_218,pcVar3,pcVar3 + psVar11->_M_string_length);
                std::__cxx11::string::operator=((string *)&local_238,(string *)local_218);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_218._0_8_ != &local_208) {
                  operator_delete((void *)local_218._0_8_,
                                  (ulong)(local_208._M_allocated_capacity + 1));
                }
              }
              cmPropertyMap::SetProperty
                        (&((this->impl)._M_t.
                           super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                           .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->
                          Properties,prop,&local_238);
              local_218._0_8_ = &local_208;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_218,"COMPILE_PDB_NAME","");
              StoreProperty<cmValue>(this_02,(string *)local_218,&local_238);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._0_8_ != &local_208) {
                operator_delete((void *)local_218._0_8_,(ulong)(local_208._M_allocated_capacity + 1)
                               );
              }
              local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_70,"COMPILE_PDB_OUTPUT_DIRECTORY","");
              local_218._0_8_ = local_238._M_string_length;
              local_218._8_8_ = local_238._M_dataplus._M_p;
              local_208._M_allocated_capacity = 5;
              local_208._8_8_ = (long)"/CMakeFiles/CMakeRelink.dir/" + 0x17;
              views._M_len = 2;
              views._M_array = (iterator)local_218;
              cmCatViews_abi_cxx11_(&local_50,views);
              StoreProperty<cmValue>(this_02,&local_70,&local_50);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_50._M_dataplus._M_p != &local_50.field_2) {
                operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1
                               );
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_70._M_dataplus._M_p != &local_70.field_2) {
                operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1
                               );
              }
              local_218._0_8_ = &local_208;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_218,"COMPILE_PDB_NAME","");
              cVar9 = GetProperty(this_02,(string *)local_218);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._0_8_ != &local_208) {
                operator_delete((void *)local_218._0_8_,(ulong)(local_208._M_allocated_capacity + 1)
                               );
              }
              local_218._0_8_ = &local_208;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_218,"COMPILE_PDB_NAME","");
              StoreProperty<cmValue>(this,(string *)local_218,cVar9);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_218._0_8_ != &local_208) {
                operator_delete((void *)local_218._0_8_,(ulong)(local_208._M_allocated_capacity + 1)
                               );
              }
              AddUtility(this,&local_238,false,
                         ((this->impl)._M_t.
                          super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                          .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile
                        );
              local_90.field_2._M_allocated_capacity = local_238.field_2._M_allocated_capacity;
              _Var12._M_p = local_238._M_dataplus._M_p;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_238._M_dataplus._M_p == &local_238.field_2) {
                return;
              }
            }
            goto LAB_0028a8b9;
          }
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_218);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_218,"PRECOMPILE_HEADERS property is already set on target (\""
                     ,0x37);
          _Var1._M_head_impl =
               (this->impl)._M_t.
               super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
               super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_218,((_Var1._M_head_impl)->Name)._M_dataplus._M_p,
                              *(size_type *)((long)&(_Var1._M_head_impl)->Name + 8));
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\")\n",3);
          pcVar2 = ((this->impl)._M_t.
                    super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>
                    .super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,&local_238);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p == &local_238.field_2) goto LAB_0028a9f3;
      }
      operator_delete(local_238._M_dataplus._M_p,
                      (ulong)(local_238.field_2._M_allocated_capacity + 1));
LAB_0028a9f3:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_218);
      std::ios_base::~ios_base(local_1a8);
      return;
    }
    pcVar2 = ((this->impl)._M_t.
              super___uniq_ptr_impl<cmTargetInternals,_std::default_delete<cmTargetInternals>_>._M_t
              .super__Tuple_impl<0UL,_cmTargetInternals_*,_std::default_delete<cmTargetInternals>_>.
              super__Head_base<0UL,_cmTargetInternals_*,_false>._M_head_impl)->Makefile;
    local_218._0_8_ = &local_208;
    local_258._M_dataplus._M_p = (pointer)0x1b;
    local_218._0_8_ = std::__cxx11::string::_M_create((ulong *)local_218,(ulong)&local_258);
    local_208._M_allocated_capacity = (size_type)local_258._M_dataplus._M_p;
    *(char *)(local_218._0_8_ + 0xb) = 't';
    *(char *)(local_218._0_8_ + 0xc) = 'y';
    *(char *)(local_218._0_8_ + 0xd) = ' ';
    *(char *)(local_218._0_8_ + 0xe) = 'i';
    *(char *)(local_218._0_8_ + 0xf) = 's';
    *(char *)(local_218._0_8_ + 0x10) = ' ';
    *(char *)(local_218._0_8_ + 0x11) = 'r';
    *(char *)(local_218._0_8_ + 0x12) = 'e';
    builtin_strncpy((char *)((long)(local_218._0_8_ + 0x10) + 3),"ad-only\n",8);
    *(undefined8 *)local_218._0_8_ = 0x6f72702045505954;
    *(char *)(local_218._0_8_ + 8) = 'p';
    *(char *)(local_218._0_8_ + 9) = 'e';
    *(char *)(local_218._0_8_ + 10) = 'r';
    *(char *)(local_218._0_8_ + 0xb) = 't';
    *(char *)(local_218._0_8_ + 0xc) = 'y';
    *(char *)(local_218._0_8_ + 0xd) = ' ';
    *(char *)(local_218._0_8_ + 0xe) = 'i';
    *(char *)(local_218._0_8_ + 0xf) = 's';
    local_218._8_8_ = local_258._M_dataplus._M_p;
    local_258._M_dataplus._M_p[local_218._0_8_] = '\0';
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_218);
  }
  local_90.field_2._M_allocated_capacity = local_208._M_allocated_capacity;
  _Var12._M_p = (pointer)local_218._0_8_;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._0_8_ == &local_208) {
    return;
  }
LAB_0028a8b9:
  operator_delete(_Var12._M_p,(ulong)(local_90.field_2._M_allocated_capacity + 1));
  return;
}

Assistant:

void cmTarget::StoreProperty(const std::string& prop, ValueType value)
{
  if (prop == propMANUALLY_ADDED_DEPENDENCIES) {
    this->impl->Makefile->IssueMessage(
      MessageType::FATAL_ERROR,
      "MANUALLY_ADDED_DEPENDENCIES property is read-only\n");
    return;
  }
  if (prop == propNAME) {
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                       "NAME property is read-only\n");
    return;
  }
  if (prop == propTYPE) {
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR,
                                       "TYPE property is read-only\n");
    return;
  }
  if (prop == propEXPORT_NAME && this->IsImported()) {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propSOURCES && this->IsImported()) {
    std::ostringstream e;
    e << "SOURCES property can't be set on imported targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }
  if (prop == propIMPORTED_GLOBAL && !this->IsImported()) {
    std::ostringstream e;
    e << "IMPORTED_GLOBAL property can't be set on non-imported targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  }

  if (prop == propINCLUDE_DIRECTORIES) {
    this->impl->IncludeDirectoriesEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->IncludeDirectoriesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_OPTIONS) {
    this->impl->CompileOptionsEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->CompileOptionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_FEATURES) {
    this->impl->CompileFeaturesEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->CompileFeaturesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propCOMPILE_DEFINITIONS) {
    this->impl->CompileDefinitionsEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->CompileDefinitionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propLINK_OPTIONS) {
    this->impl->LinkOptionsEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkOptionsEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propLINK_DIRECTORIES) {
    this->impl->LinkDirectoriesEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkDirectoriesEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propPRECOMPILE_HEADERS) {
    this->impl->PrecompileHeadersEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->PrecompileHeadersEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propLINK_LIBRARIES) {
    this->impl->LinkImplementationPropertyEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkImplementationPropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES) {
    this->impl->LinkInterfacePropertyEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkInterfacePropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT) {
    this->impl->LinkInterfaceDirectPropertyEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkInterfaceDirectPropertyEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propINTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE) {
    this->impl->LinkInterfaceDirectExcludePropertyEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->LinkInterfaceDirectExcludePropertyEntries.emplace_back(value,
                                                                         lfbt);
    }
  } else if (prop == propSOURCES) {
    this->impl->SourceEntries.clear();
    if (value) {
      cmListFileBacktrace lfbt = this->impl->Makefile->GetBacktrace();
      this->impl->SourceEntries.emplace_back(value, lfbt);
    }
  } else if (prop == propIMPORTED_GLOBAL) {
    if (!cmIsOn(value)) {
      std::ostringstream e;
      e << "IMPORTED_GLOBAL property can't be set to FALSE on targets (\""
        << this->impl->Name << "\")\n";
      this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
    /* no need to change anything if value does not change */
    if (!this->impl->ImportedGloballyVisible) {
      this->impl->ImportedGloballyVisible = true;
      this->GetGlobalGenerator()->IndexTarget(this);
    }
  } else if (cmHasLiteralPrefix(prop, "IMPORTED_LIBNAME") &&
             !this->impl->CheckImportedLibName(
               prop,
               value ? value
                     : std::string{})) { // NOLINT(bugprone-branch-clone)
    /* error was reported by check method */
  } else if (prop == propCUDA_PTX_COMPILATION &&
             this->GetType() != cmStateEnums::OBJECT_LIBRARY) {
    std::ostringstream e;
    e << "CUDA_PTX_COMPILATION property can only be applied to OBJECT "
         "targets (\""
      << this->impl->Name << "\")\n";
    this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
    return;
  } else if (prop == propPRECOMPILE_HEADERS_REUSE_FROM) {
    if (this->GetProperty("PRECOMPILE_HEADERS")) {
      std::ostringstream e;
      e << "PRECOMPILE_HEADERS property is already set on target (\""
        << this->impl->Name << "\")\n";
      this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return;
    }
    auto* reusedTarget = this->impl->Makefile->GetCMakeInstance()
                           ->GetGlobalGenerator()
                           ->FindTarget(value);
    if (!reusedTarget) {
      const std::string e(
        "PRECOMPILE_HEADERS_REUSE_FROM set with non existing target");
      this->impl->Makefile->IssueMessage(MessageType::FATAL_ERROR, e);
      return;
    }

    std::string reusedFrom = reusedTarget->GetSafeProperty(prop);
    if (reusedFrom.empty()) {
      reusedFrom = ConvertToString(value);
    }

    this->impl->Properties.SetProperty(prop, reusedFrom);

    reusedTarget->SetProperty("COMPILE_PDB_NAME", reusedFrom);
    reusedTarget->SetProperty("COMPILE_PDB_OUTPUT_DIRECTORY",
                              cmStrCat(reusedFrom, ".dir/"));

    cmValue tmp = reusedTarget->GetProperty("COMPILE_PDB_NAME");
    this->SetProperty("COMPILE_PDB_NAME", tmp);
    this->AddUtility(reusedFrom, false, this->impl->Makefile);
  } else if (prop == propC_STANDARD || prop == propCXX_STANDARD ||
             prop == propCUDA_STANDARD || prop == propHIP_STANDARD ||
             prop == propOBJC_STANDARD || prop == propOBJCXX_STANDARD) {
    if (value) {
      this->impl->LanguageStandardProperties[prop] =
        BTs<std::string>(value, this->impl->Makefile->GetBacktrace());
    } else {
      this->impl->LanguageStandardProperties.erase(prop);
    }
  } else if (this->impl->HeadersFileSets.WriteProperties(
               this, this->impl.get(), prop, value, true)) {
    /* Handled in the `if` condition. */
  } else if (this->impl->CxxModulesFileSets.WriteProperties(
               this, this->impl.get(), prop, value, true)) {
    /* Handled in the `if` condition. */
  } else if (this->impl->CxxModuleHeadersFileSets.WriteProperties(
               this, this->impl.get(), prop, value, true)) {
    /* Handled in the `if` condition. */
  } else {
    this->impl->Properties.SetProperty(prop, value);
  }
}